

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::ReadyEvent::~ReadyEvent(ReadyEvent *this)

{
  std::unique_ptr<discordpp::Application,_std::default_delete<discordpp::Application>_>::~unique_ptr
            (&(this->application).t_);
  std::unique_ptr<std::array<int,_2UL>,_std::default_delete<std::array<int,_2UL>_>_>::~unique_ptr
            (&(this->shard).super_field<std::array<int,_2UL>_>.t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->resume_gateway_url).t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->session_id).t_);
  std::
  unique_ptr<std::vector<discordpp::Guild,_std::allocator<discordpp::Guild>_>,_std::default_delete<std::vector<discordpp::Guild,_std::allocator<discordpp::Guild>_>_>_>
  ::~unique_ptr(&(this->guilds).t_);
  std::unique_ptr<discordpp::User,_std::default_delete<discordpp::User>_>::~unique_ptr
            (&(this->user).t_);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
            ((unique_ptr<int,_std::default_delete<int>_> *)this);
  return;
}

Assistant:

ReadyEvent(
        field<int> v = uninitialized,
        field<User> user = uninitialized,
        field<std::vector<Guild> > guilds = uninitialized,
        field<std::string> session_id = uninitialized,
        field<std::string> resume_gateway_url = uninitialized,
        omittable_field<std::array<int, 2>> shard = omitted,
        field<Application> application = uninitialized
    ):
        v(v),
        user(user),
        guilds(guilds),
        session_id(session_id),
        resume_gateway_url(resume_gateway_url),
        shard(shard),
        application(application)
    {}